

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

void __thiscall
boost::runtime::
argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
::produce_argument(argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   *this,cstring *source,cstring *param_name,arguments_store *store)

{
  bool bVar1;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  cstring *in_stack_ffffffffffffff98;
  cstring *in_stack_ffffffffffffffa0;
  value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *in_stack_ffffffffffffffa8;
  string local_50 [32];
  basic_cstring<const_char> local_30 [3];
  
  unit_test::basic_cstring<const_char>::basic_cstring(local_30,in_RDX);
  bVar1 = unit_test::basic_cstring<const_char>::empty((basic_cstring<const_char> *)0x26888a);
  if (bVar1) {
    std::__cxx11::string::string(local_50,(string *)(in_RDI + 8));
  }
  else {
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&stack0xffffffffffffffa0,in_RDX);
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&stack0xffffffffffffff90,in_RSI);
    value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::interpret(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  arguments_store::set<std::__cxx11::string>
            ((arguments_store *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        store.set( param_name, source.empty() ? m_optional_value : m_interpreter.interpret( param_name, source ) );
    }